

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_DaggerAlert
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *emitter;
  char *pcVar2;
  AActor *target;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_003fec83;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003fec6a:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003fec83:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x14d,
                  "int AF_AActor_DaggerAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  emitter = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (emitter == (AActor *)0x0) goto LAB_003fec0f;
    bVar1 = DObject::IsKindOf((DObject *)emitter,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003fec83;
    }
  }
  else {
    if (emitter != (AActor *)0x0) goto LAB_003fec6a;
LAB_003fec0f:
    emitter = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_003feca2;
  }
  if (param[1].field_0.field_3.Type == '\x03') {
    target = (AActor *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (target != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003feca2;
        }
        goto LAB_003fec58;
      }
    }
    else if (target != (AActor *)0x0) goto LAB_003fec73;
    target = (AActor *)0x0;
LAB_003fec58:
    P_DaggerAlert(target,emitter);
    return 0;
  }
LAB_003fec73:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003feca2:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x14e,
                "int AF_AActor_DaggerAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DaggerAlert)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(target, AActor);
	// Note that the emitter is self, not the target of the alert! Target can be NULL.
	P_DaggerAlert(target, self);
	return 0;
}